

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParserTest_setLogCallbackTest_Test::TestBody
          (OpenDDLParserTest_setLogCallbackTest_Test *this)

{
  bool bVar1;
  _func_void_LogSeverity_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **actual;
  undefined8 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar;
  OpenDDLParser myParser;
  AssertHelper local_110;
  _Any_data local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  AssertHelper local_e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined1 local_d8 [28];
  undefined4 local_bc;
  undefined1 local_b8 [24];
  _Invoker_type p_Stack_a0;
  logCallback local_98;
  OpenDDLParser local_70;
  
  OpenDDLParser::OpenDDLParser(&local_70);
  local_110.data_ = (AssertHelperData *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_108,&local_70);
  testing::internal::
  CmpHelperEQ<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            ((internal *)&local_e8,"nullptr","myParser.getLogCallback()",&local_110.data_,
             (function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_108);
  if ((code *)local_f8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_f8._M_allocated_capacity)(&local_108,&local_108,3);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x8a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*local_108._M_unused._M_object + 8))();
      }
      local_108._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_108,&local_70);
    local_e8.data_ = (AssertHelperData *)local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    local_bc = 1;
    if ((code *)local_f8._M_allocated_capacity == (code *)0x0) {
      std::__throw_bad_function_call();
      goto LAB_00141015;
    }
    (*(code *)local_f8._8_8_)(&local_108,&local_bc,&local_e8);
    if (local_e8.data_ != (AssertHelperData *)local_d8) {
      operator_delete(local_e8.data_,local_d8._0_8_ + 1);
    }
    if ((code *)local_f8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_f8._M_allocated_capacity)(&local_108,&local_108,3);
    }
  }
  testing::Message::Message((Message *)&local_108);
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
             ,0x8b,
             "Expected: myParser.getLogCallback()(ddl_info_msg, \"\") throws an exception of type std::bad_function_call.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_unused._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*local_108._M_unused._M_object + 8))();
    }
    local_108._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
  }
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_functor._M_unused._M_object = OpenDDLParserTest::testLogCallback;
  local_98._M_invoker =
       std::
       _Function_handler<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       std::
       _Function_handler<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  OpenDDLParser::setLogCallback(&local_70,&local_98);
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  local_110.data_ = (AssertHelperData *)OpenDDLParserTest::testLogCallback;
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_108,&local_70);
  actual = __const_std__function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>__target<void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&)>__const_
                     (&local_108);
  testing::internal::
  CmpHelperEQ<void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&),void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&)>
            ((internal *)&local_e8,"&OpenDDLParserTest::testLogCallback",
             "*myParser.getLogCallback().target<cbType>()",
             (_func_void_LogSeverity_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              **)&local_110,actual);
  if ((code *)local_f8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_f8._M_allocated_capacity)(&local_108,&local_108,3);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*local_108._M_unused._M_object + 8))();
      }
      local_108._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_110.data_ = (AssertHelperData *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_108,&local_70);
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            ((internal *)&local_e8,"nullptr","myParser.getLogCallback()",&local_110.data_,
             (function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_108);
  if ((code *)local_f8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_f8._M_allocated_capacity)(&local_108,&local_108,3);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*local_108._M_unused._M_object + 8))();
      }
      local_108._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_108,&local_70);
  local_e8.data_._0_1_ = (internal)((code *)local_f8._M_allocated_capacity != (code *)0x0);
  local_e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((code *)local_f8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_f8._M_allocated_capacity)(&local_108,&local_108,3);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_108,(internal *)&local_e8,
               (AssertionResult *)"(bool)myParser.getLogCallback()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_d8 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x91,(char *)local_108._M_unused._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_d8 + 0x10),(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_d8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_unused._0_8_ != &local_f8) {
      operator_delete(local_108._M_unused._M_object,(ulong)(local_f8._M_allocated_capacity + 1));
    }
    if (local_110.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_110.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_110.data_ + 8))();
      }
      local_110.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._0_8_ = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = (_Manager_type)0x0;
  p_Stack_a0 = (_Invoker_type)0x0;
  OpenDDLParser::setLogCallback(&local_70,(logCallback *)local_b8);
  if ((_Manager_type)local_b8._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_b8._16_8_)(local_b8,local_b8,3);
  }
  local_110.data_ = (AssertHelperData *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_108,&local_70);
  testing::internal::
  CmpHelperEQ<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            ((internal *)&local_e8,"nullptr","myParser.getLogCallback()",&local_110.data_,
             (function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_108);
  if ((code *)local_f8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_f8._M_allocated_capacity)(&local_108,&local_108,3);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*local_108._M_unused._M_object + 8))();
      }
      local_108._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_108,&local_70);
  local_e8.data_._0_1_ = (internal)((code *)local_f8._M_allocated_capacity == (code *)0x0);
  local_e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((code *)local_f8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_f8._M_allocated_capacity)(&local_108,&local_108,3);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_108,(internal *)&local_e8,
               (AssertionResult *)"(bool)myParser.getLogCallback()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_d8 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x95,(char *)local_108._M_unused._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_d8 + 0x10),(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_d8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_unused._0_8_ != &local_f8) {
      operator_delete(local_108._M_unused._M_object,(ulong)(local_f8._M_allocated_capacity + 1));
    }
    if (local_110.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_110.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_110.data_ + 8))();
      }
      local_110.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_108,&local_70);
    local_e8.data_ = (AssertHelperData *)local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    local_110.data_._0_4_ = 1;
    if ((code *)local_f8._M_allocated_capacity == (code *)0x0) {
LAB_00141015:
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    (*(code *)local_f8._8_8_)(&local_108,&local_110,&local_e8);
    if (local_e8.data_ != (AssertHelperData *)local_d8) {
      operator_delete(local_e8.data_,local_d8._0_8_ + 1);
    }
    if ((code *)local_f8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_f8._M_allocated_capacity)(&local_108,&local_108,3);
    }
  }
  testing::Message::Message((Message *)&local_108);
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
             ,0x96,
             "Expected: myParser.getLogCallback()(ddl_info_msg, \"\") throws an exception of type std::bad_function_call.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_unused._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_unused._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*local_108._M_unused._M_object + 8))();
    }
    local_108._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
  }
  OpenDDLParser::~OpenDDLParser(&local_70);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, setLogCallbackTest) {
    OpenDDLParser myParser;
    EXPECT_EQ(nullptr, myParser.getLogCallback());
    EXPECT_THROW(myParser.getLogCallback()(ddl_info_msg, ""), std::bad_function_call);

    typedef decltype(&OpenDDLParserTest::testLogCallback) cbType;
    myParser.setLogCallback(OpenDDLParserTest::testLogCallback);
    EXPECT_EQ(&OpenDDLParserTest::testLogCallback, *myParser.getLogCallback().target<cbType>());
    EXPECT_NE(nullptr, myParser.getLogCallback());
    EXPECT_TRUE((bool)myParser.getLogCallback());

    myParser.setLogCallback(nullptr);
    EXPECT_EQ(nullptr, myParser.getLogCallback());
    EXPECT_FALSE((bool)myParser.getLogCallback());
    EXPECT_THROW(myParser.getLogCallback()(ddl_info_msg, ""), std::bad_function_call);
}